

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString VStringFromFormat(char *format,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  TestMemoryAllocator *pTVar3;
  undefined4 extraout_var;
  __va_list_tag *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  SimpleString SVar5;
  va_list argsCopy;
  char defaultBuffer [100];
  SimpleString local_c8;
  __va_list_tag local_b8;
  char local_98 [104];
  char *otherBuffer;
  
  local_b8.reg_save_area = in_RDX->reg_save_area;
  local_b8.gp_offset = in_RDX->gp_offset;
  local_b8.fp_offset = in_RDX->fp_offset;
  local_b8.overflow_arg_area = in_RDX->overflow_arg_area;
  format[0] = '\0';
  format[1] = '\0';
  format[2] = '\0';
  format[3] = '\0';
  format[4] = '\0';
  format[5] = '\0';
  format[6] = '\0';
  format[7] = '\0';
  format[8] = '\0';
  format[9] = '\0';
  format[10] = '\0';
  format[0xb] = '\0';
  format[0xc] = '\0';
  format[0xd] = '\0';
  format[0xe] = '\0';
  format[0xf] = '\0';
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)format,"");
  uVar1 = (*PlatformSpecificVSNprintf)(local_98,100,(char *)args,in_RDX);
  if (uVar1 < 100) {
    local_c8.buffer_ = (char *)0x0;
    local_c8.bufferSize_ = 0;
    SimpleString::copyBufferToNewInternalBuffer(&local_c8,local_98);
    SimpleString::copyBufferToNewInternalBuffer((SimpleString *)format,&local_c8);
    SimpleString::deallocateInternalBuffer(&local_c8);
    sVar4 = extraout_RDX;
  }
  else {
    pTVar3 = SimpleString::stringAllocator_;
    if (SimpleString::stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar3 = defaultNewArrayAllocator();
    }
    sVar4 = (long)(int)uVar1 + 1;
    iVar2 = (*pTVar3->_vptr_TestMemoryAllocator[2])
                      (pTVar3,sVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
                       ,0x36c);
    otherBuffer = (char *)CONCAT44(extraout_var,iVar2);
    (*PlatformSpecificVSNprintf)(otherBuffer,sVar4,(char *)args,&local_b8);
    SimpleString::SimpleString(&local_c8,otherBuffer);
    SimpleString::copyBufferToNewInternalBuffer((SimpleString *)format,&local_c8);
    SimpleString::deallocateInternalBuffer(&local_c8);
    pTVar3 = SimpleString::stringAllocator_;
    if (SimpleString::stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar3 = defaultNewArrayAllocator();
    }
    (*pTVar3->_vptr_TestMemoryAllocator[3])
              (pTVar3,otherBuffer,sVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x370);
    sVar4 = extraout_RDX_00;
  }
  SVar5.bufferSize_ = sVar4;
  SVar5.buffer_ = format;
  return SVar5;
}

Assistant:

SimpleString VStringFromFormat(const char* format, va_list args)
{
    va_list argsCopy;
    va_copy(argsCopy, args);
    enum
    {
        sizeOfdefaultBuffer = 100
    };
    char defaultBuffer[sizeOfdefaultBuffer];
    SimpleString resultString;

    size_t size = (size_t)PlatformSpecificVSNprintf(defaultBuffer, sizeOfdefaultBuffer, format, args);
    if (size < sizeOfdefaultBuffer) {
        resultString = SimpleString(defaultBuffer);
    }
    else {
        size_t newBufferSize = size + 1;
        char* newBuffer = SimpleString::allocStringBuffer(newBufferSize, __FILE__, __LINE__);
        PlatformSpecificVSNprintf(newBuffer, newBufferSize, format, argsCopy);
        resultString = SimpleString(newBuffer);

        SimpleString::deallocStringBuffer(newBuffer, newBufferSize, __FILE__, __LINE__);
    }
    va_end(argsCopy);
    return resultString;
}